

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLReader::containsWhiteSpace(XMLReader *this,XMLCh *toCheck,XMLSize_t count)

{
  XMLCh XVar1;
  XMLCh *endPtr;
  XMLCh *curCh;
  XMLSize_t count_local;
  XMLCh *toCheck_local;
  XMLReader *this_local;
  
  endPtr = toCheck;
  do {
    if (toCheck + count <= endPtr) {
      return false;
    }
    XVar1 = *endPtr;
    endPtr = endPtr + 1;
  } while ((this->fgCharCharsTable[(ushort)XVar1] & 0x80) == 0);
  return true;
}

Assistant:

bool XMLReader::containsWhiteSpace(const   XMLCh* const    toCheck
                            , const XMLSize_t     count) const
{
    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    while (curCh < endPtr)
    {
        if (fgCharCharsTable[*curCh++] & gWhitespaceCharMask)
            return true;
    }
    return false;
}